

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(QPDFFormFieldObjectHelper *this)

{
  Members *__p;
  QPDFObjectHandle local_20;
  QPDFFormFieldObjectHelper *local_10;
  QPDFFormFieldObjectHelper *this_local;
  
  local_10 = this;
  QPDFObjectHandle::newNull();
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,&local_20);
  QPDFObjectHandle::~QPDFObjectHandle(&local_20);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFFormFieldObjectHelper_0058be88;
  __p = (Members *)operator_new(1);
  std::shared_ptr<QPDFFormFieldObjectHelper::Members>::
  shared_ptr<QPDFFormFieldObjectHelper::Members,void>(&this->m,__p);
  return;
}

Assistant:

QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper() :
    QPDFObjectHelper(QPDFObjectHandle::newNull()),
    m(new Members())
{
}